

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdg-datastore.cc
# Opt level: O2

uint32_t detect_read_size(string *read_filename)

{
  uint32_t uVar1;
  bool bVar2;
  uint uVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var4
  ;
  uint32_t i;
  uint uVar5;
  ulong uVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> read_sizes;
  FastqRecord rec;
  FastqReader<FastqRecord> fastqReader;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&read_sizes,100,(allocator_type *)&fastqReader);
  rec.name._M_dataplus._M_p = (pointer)&rec.name.field_2;
  rec.name._M_string_length = 0;
  rec.name.field_2._M_local_buf[0] = '\0';
  rec.comment._M_dataplus._M_p = (pointer)&rec.comment.field_2;
  rec.comment._M_string_length = 0;
  rec.comment.field_2._M_local_buf[0] = '\0';
  rec.seq._M_dataplus._M_p = (pointer)&rec.seq.field_2;
  rec.seq._M_string_length = 0;
  rec.seq.field_2._M_local_buf[0] = '\0';
  rec.qual._M_dataplus._M_p = (pointer)&rec.qual.field_2;
  rec.qual._M_string_length = 0;
  rec.qual.field_2._M_local_buf[0] = '\0';
  FastqReader<FastqRecord>::FastqReader(&fastqReader,(FastxReaderParams)0x0,read_filename);
  uVar6 = 0;
  while( true ) {
    bVar2 = FastqReader<FastqRecord>::next_record(&fastqReader,&rec);
    if (!bVar2) break;
    if ((ulong)((long)read_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)read_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar6) break;
    read_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] = (uint)rec.seq._M_string_length;
    uVar6 = (ulong)((int)uVar6 + 1);
  }
  for (uVar5 = 100; uVar5 != 10000; uVar5 = uVar5 + 1) {
    bVar2 = FastqReader<FastqRecord>::next_record(&fastqReader,&rec);
    if (!bVar2) break;
    uVar3 = rand();
    if ((uint)((ulong)uVar3 % (ulong)uVar5) < 100) {
      read_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[(ulong)uVar3 % (ulong)uVar5] = (uint)rec.seq._M_string_length
      ;
    }
  }
  _Var4 = std::
          __max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (read_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     read_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  uVar1 = *_Var4._M_current;
  FastqReader<FastqRecord>::~FastqReader(&fastqReader);
  FastqRecord::~FastqRecord(&rec);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&read_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return uVar1;
}

Assistant:

uint32_t detect_read_size(const std::string &read_filename) {
    std::vector<uint32_t> read_sizes(100);

    FastqRecord rec;
    FastqReader<FastqRecord> fastqReader({}, read_filename);
    uint32_t i = 0;
    while(fastqReader.next_record(rec) and i < read_sizes.size()) {
        read_sizes[i++] = rec.seq.size();
    }
    for (uint32_t i = 100; i < 10000 and fastqReader.next_record(rec); i++) {
        uint32_t j = std::rand()%i;
        if (j < 100) {
            read_sizes[j] = rec.seq.size();
        }
    }
    return (*std::max_element(read_sizes.begin(), read_sizes.end()));
}